

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::Unlock(CWallet *this,CKeyingMaterial *vMasterKeyIn)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0xdb3,false);
  p_Var1 = &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x20))(*(long **)(p_Var3 + 2),vMasterKeyIn);
    if (cVar2 == '\0') goto LAB_00458612;
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::operator=
            (&this->vMasterKey,vMasterKeyIn);
LAB_00458612:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyStatusChanged,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (_Rb_tree_header *)p_Var3 == p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::Unlock(const CKeyingMaterial& vMasterKeyIn)
{
    {
        LOCK(cs_wallet);
        for (const auto& spk_man_pair : m_spk_managers) {
            if (!spk_man_pair.second->CheckDecryptionKey(vMasterKeyIn)) {
                return false;
            }
        }
        vMasterKey = vMasterKeyIn;
    }
    NotifyStatusChanged(this);
    return true;
}